

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Clasp::SatReader::parseHeuristic(SatReader *this,uint32 maxVar,SharedContext *ctx)

{
  undefined2 uVar1;
  undefined2 uVar2;
  uint uVar3;
  int iVar4;
  size_t *in_RCX;
  uchar *sig;
  uint in_ESI;
  EVP_PKEY_CTX *ctx_00;
  DomainTable *in_RDI;
  uchar *in_R8;
  size_t in_R9;
  Literal unaff_retaddr;
  DomModType unaff_retaddr_00;
  uint16 prio;
  int16 bias;
  Literal atom;
  Heuristic_t type;
  ProgramReader *in_stack_ffffffffffffffc0;
  Var in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined2 in_stack_ffffffffffffffdc;
  undefined2 in_stack_ffffffffffffffde;
  Literal local_20;
  Heuristic_t local_1c [3];
  uint16 in_stack_fffffffffffffff0;
  int16 in_stack_fffffffffffffff2;
  DomainTable *this_00;
  
  this_00 = in_RDI;
  uVar3 = Potassco::ProgramReader::matchPos
                    (in_stack_ffffffffffffffc0,(uint)((ulong)in_RDI >> 0x20),(char *)0x1c528c);
  Potassco::Heuristic_t::Heuristic_t(local_1c,uVar3);
  ctx_00 = (EVP_PKEY_CTX *)(ulong)in_ESI;
  local_20 = matchLit((SatReader *)
                      CONCAT26(in_stack_ffffffffffffffde,
                               CONCAT24(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8)),
                      in_stack_ffffffffffffffd4);
  Literal::sign(&local_20,ctx_00,sig,in_RCX,in_R8,in_R9);
  Potassco::ProgramReader::require
            (in_stack_ffffffffffffffc0,SUB81((ulong)in_RDI >> 0x38,0),(char *)0x1c52cb);
  iVar4 = Potassco::ProgramReader::matchInt
                    (in_stack_ffffffffffffffc0,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                     (char *)0x1c52e5);
  uVar1 = (undefined2)iVar4;
  uVar3 = Potassco::ProgramReader::matchPos
                    (in_stack_ffffffffffffffc0,(uint)((ulong)in_RDI >> 0x20),(char *)0x1c52ff);
  uVar2 = (undefined2)uVar3;
  Literal::var(&local_20);
  matchLit((SatReader *)CONCAT26(uVar1,CONCAT24(uVar2,local_1c[0].val_)),in_stack_ffffffffffffffd4);
  DomainTable::add(this_00,in_ESI,unaff_retaddr_00,in_stack_fffffffffffffff2,
                   in_stack_fffffffffffffff0,unaff_retaddr);
  return;
}

Assistant:

void SatReader::parseHeuristic(uint32 maxVar, SharedContext& ctx) {
	using Potassco::Heuristic_t;
	Heuristic_t type = static_cast<Heuristic_t>(matchPos(Heuristic_t::eMax, "heuristic: modifier expected"));
	Literal atom = matchLit(maxVar);
	require(!atom.sign(), "heuristic: positive literal expected");
	int16    bias = (int16)matchInt(INT16_MIN, INT16_MAX, "heuristic: bias expected");
	uint16   prio = (uint16)matchPos(UINT16_MAX, "heuristic: priority expected");
	ctx.heuristic.add(atom.var(), type, bias, prio, matchLit(maxVar));
}